

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2xml.hpp
# Opt level: O0

bool __thiscall ert::JsonSaxConsumer::number_unsigned(JsonSaxConsumer *this,number_unsigned_t val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__string;
  long in_RDI;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var1;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_00000158;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000160;
  undefined2 local_58;
  unsigned_long in_stack_ffffffffffffffb8;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined2 local_18;
  
  __string = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1b0);
  std::__cxx11::to_string(in_stack_ffffffffffffffb8);
  _Var1 = std::quoted<char,std::char_traits<char>,std::allocator<char>>
                    (__string,(char)((ulong)in_RDI >> 0x38),(char)((ulong)in_RDI >> 0x30));
  local_20 = _Var1._M_string;
  local_58 = _Var1._8_2_;
  local_18 = local_58;
  std::__detail::operator<<(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_40);
  *(undefined1 *)(in_RDI + 0xd) = 1;
  return true;
}

Assistant:

bool number_unsigned(number_unsigned_t val) override
    {
        current_object_ << std::quoted(std::to_string(val));
        has_attributes_ = true;
        return true;
    }